

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_address.cpp
# Opt level: O0

string * __thiscall miniros::network::NetAddress::str_abi_cxx11_(NetAddress *this)

{
  ostream *this_00;
  long in_RSI;
  string *in_RDI;
  stringstream ss;
  stringstream local_198 [16];
  ostream local_188 [392];
  
  std::__cxx11::stringstream::stringstream(local_198);
  std::operator<<(local_188,(string *)(in_RSI + 8));
  if (*(int *)(in_RSI + 0x28) != 0) {
    this_00 = std::operator<<(local_188,":");
    std::ostream::operator<<(this_00,*(int *)(in_RSI + 0x28));
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

std::string NetAddress::str() const
{
  std::stringstream ss;
  ss << address;
  if (port) {
    ss << ":" << port;
  }
  return ss.str();
}